

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TagExtracter::acceptTag(TagExtracter *this,string *tag)

{
  value_type *in_stack_ffffffffffffffa8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb0;
  string local_30 [48];
  
  toLower(in_stack_ffffffffffffffa8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

virtual void acceptTag( std::string const& tag ) {
            m_tags.insert( toLower( tag ) );
        }